

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
cnn::Concatenate::forward_impl
          (Concatenate *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  Tensor *this_00;
  bool bVar1;
  uint uVar2;
  reference ppTVar3;
  reference pvVar4;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *in_RSI;
  ulong __n;
  long in_RDI;
  uint rows_1;
  Tensor *xi;
  Tensor *x_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *__range1_1;
  uint k;
  uint ind;
  Tensor *x;
  const_iterator __end1;
  const_iterator __begin1;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *__range1;
  uint rows;
  DenseBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  value_type in_stack_fffffffffffffee4;
  size_type in_stack_fffffffffffffef8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  uint in_stack_ffffffffffffff0c;
  Index in_stack_ffffffffffffff10;
  DenseBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff18;
  __normal_iterator<const_cnn::Tensor_*const_*,_std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>_>
  local_58;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *local_50;
  uint local_48;
  value_type local_44;
  Tensor *local_40;
  Tensor **local_38;
  __normal_iterator<const_cnn::Tensor_*const_*,_std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>_>
  local_30 [2];
  int local_1c;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *local_10;
  
  local_1c = 0;
  local_10 = in_RSI;
  local_30[0]._M_current =
       (Tensor **)
       std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::begin
                 ((vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *)
                  in_stack_fffffffffffffed8);
  local_38 = (Tensor **)
             std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::end
                       ((vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *)
                        in_stack_fffffffffffffed8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_cnn::Tensor_*const_*,_std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>_>
                        *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       (__normal_iterator<const_cnn::Tensor_*const_*,_std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>_>
                        *)in_stack_fffffffffffffed8);
    if (!bVar1) break;
    ppTVar3 = __gnu_cxx::
              __normal_iterator<const_cnn::Tensor_*const_*,_std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>_>
              ::operator*(local_30);
    local_40 = *ppTVar3;
    uVar2 = Dim::rows(&local_40->d);
    local_1c = uVar2 + local_1c;
    __gnu_cxx::
    __normal_iterator<const_cnn::Tensor_*const_*,_std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>_>
    ::operator++(local_30);
  }
  std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::size(local_10);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  local_44 = 0;
  local_48 = 0;
  local_50 = local_10;
  local_58._M_current =
       (Tensor **)
       std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::begin
                 ((vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *)
                  in_stack_fffffffffffffed8);
  std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::end
            ((vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *)
             in_stack_fffffffffffffed8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_cnn::Tensor_*const_*,_std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>_>
                        *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       (__normal_iterator<const_cnn::Tensor_*const_*,_std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>_>
                        *)in_stack_fffffffffffffed8);
    if (!bVar1) break;
    ppTVar3 = __gnu_cxx::
              __normal_iterator<const_cnn::Tensor_*const_*,_std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>_>
              ::operator*(&local_58);
    this_00 = *ppTVar3;
    __n = (ulong)local_48;
    in_stack_fffffffffffffee4 = local_44;
    local_48 = local_48 + 1;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x50),__n);
    *pvVar4 = in_stack_fffffffffffffee4;
    uVar2 = Dim::rows(&this_00->d);
    Tensor::operator*((Tensor *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    Tensor::operator*((Tensor *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>
    ::middleRows<unsigned_int>
              (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
    Eigen::Block<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,-1,-1,false>::
    operator=((Block<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>
               *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
              in_stack_fffffffffffffed8);
    local_44 = uVar2 + local_44;
    __gnu_cxx::
    __normal_iterator<const_cnn::Tensor_*const_*,_std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>_>
    ::operator++(&local_58);
  }
  return;
}

Assistant:

void Concatenate::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
  unsigned rows = 0;
  for (auto x : xs) rows += x->d.rows();
  // the following should use auxiliary memory
  src_row_indices.resize(xs.size());
  unsigned ind = 0;
  unsigned k = 0;
  for (auto x : xs) {
    src_row_indices[k++] = ind;
    auto & xi = *x;
    const unsigned rows = xi.d.rows();
#if HAVE_CUDA
    assert(xi.d.cols() == 1); // this can be relaxed to the same everywhere
    CUDA_CHECK(cudaMemcpyAsync(&fx.v[ind], &xi.v[0], sizeof(float) * rows, cudaMemcpyDeviceToDevice));
#else
    (*fx).middleRows(ind, rows) = *xi;
#endif
    ind += rows;
  }
}